

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# goeslrit.cc
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  uint uVar2;
  ulong uVar3;
  pointer pPVar4;
  size_type sVar5;
  ostream *poVar6;
  pointer this;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *this_00;
  uchar *puVar7;
  int *piVar8;
  char *pcVar9;
  bool bVar10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *buf_1;
  ofstream fout;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *spdu;
  iterator __end2;
  iterator __begin2;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *__range2;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  spdus;
  VCDU vcdu;
  array<unsigned_char,_892UL> buf;
  Assembler assembler;
  unique_ptr<PacketReader,_std::default_delete<PacketReader>_> reader;
  Options opts;
  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
  *in_stack_fffffffffffff838;
  Options *in_stack_fffffffffffff840;
  ostream *in_stack_fffffffffffff848;
  set<int,_std::less<int>,_std::allocator<int>_> *in_stack_fffffffffffff850;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff858;
  ostream *in_stack_fffffffffffff860;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff868;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff870;
  undefined7 in_stack_fffffffffffff878;
  byte in_stack_fffffffffffff87f;
  undefined4 in_stack_fffffffffffff8b0;
  undefined2 in_stack_fffffffffffff8b4;
  undefined1 in_stack_fffffffffffff8b6;
  undefined1 in_stack_fffffffffffff8b7;
  char local_738 [88];
  char **in_stack_fffffffffffff920;
  int in_stack_fffffffffffff92c;
  VCDU *in_stack_fffffffffffff9c0;
  Assembler *in_stack_fffffffffffff9c8;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
  *in_stack_fffffffffffffa30;
  Options *in_stack_fffffffffffffa38;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
  *in_stack_fffffffffffffa88;
  string local_538 [32];
  string local_518 [32];
  string local_4f8 [32];
  reference local_4d8;
  unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *local_4d0;
  __normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
  local_4c8;
  undefined1 *local_4c0;
  VCDU local_4b8;
  undefined1 local_4b0 [28];
  int local_494;
  VCDU local_490;
  raw local_484;
  int local_d4;
  byte local_40;
  int local_4;
  
  local_4 = 0;
  parseOptions(in_stack_fffffffffffff92c,in_stack_fffffffffffff920);
  std::unique_ptr<PacketReader,std::default_delete<PacketReader>>::
  unique_ptr<std::default_delete<PacketReader>,void>
            ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
             in_stack_fffffffffffff840);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::make_unique<NanomsgReader,std::__cxx11::string&>(in_stack_fffffffffffff858);
    std::unique_ptr<PacketReader,std::default_delete<PacketReader>>::operator=
              ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
               in_stack_fffffffffffff850,
               (unique_ptr<NanomsgReader,_std::default_delete<NanomsgReader>_> *)
               in_stack_fffffffffffff848);
    std::unique_ptr<NanomsgReader,_std::default_delete<NanomsgReader>_>::~unique_ptr
              ((unique_ptr<NanomsgReader,_std::default_delete<NanomsgReader>_> *)
               in_stack_fffffffffffff840);
  }
  else {
    bVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)in_stack_fffffffffffff850);
    if (bVar1) {
      poVar6 = std::operator<<((ostream *)&std::cerr,"No input specified");
      std::ostream::operator<<(poVar6,std::endl<char,std::char_traits<char>>);
      local_4 = 1;
      local_d4 = 1;
      goto LAB_0012eab1;
    }
    std::
    make_unique<FileReader,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&>
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)in_stack_fffffffffffff858);
    std::unique_ptr<PacketReader,std::default_delete<PacketReader>>::operator=
              ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
               in_stack_fffffffffffff850,
               (unique_ptr<FileReader,_std::default_delete<FileReader>_> *)in_stack_fffffffffffff848
              );
    std::unique_ptr<FileReader,_std::default_delete<FileReader>_>::~unique_ptr
              ((unique_ptr<FileReader,_std::default_delete<FileReader>_> *)in_stack_fffffffffffff840
              );
  }
  util::mkdirp((string *)
               CONCAT17(in_stack_fffffffffffff8b7,
                        CONCAT16(in_stack_fffffffffffff8b6,
                                 CONCAT24(in_stack_fffffffffffff8b4,in_stack_fffffffffffff8b0))));
  ::assembler::Assembler::Assembler((Assembler *)0x12e4fe);
  while( true ) {
    pPVar4 = std::unique_ptr<PacketReader,_std::default_delete<PacketReader>_>::operator->
                       ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)0x12e50f);
    uVar2 = (*pPVar4->_vptr_PacketReader[2])(pPVar4,&local_484);
    if ((uVar2 & 1) == 0) break;
    VCDU::VCDU(&local_490,&local_484);
    bVar1 = std::set<int,_std::less<int>,_std::allocator<int>_>::empty
                      ((set<int,_std::less<int>,_std::allocator<int>_> *)0x12e55e);
    bVar10 = false;
    if (!bVar1) {
      local_494 = VCDU::getVCID((VCDU *)0x12e585);
      sVar5 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                        (in_stack_fffffffffffff850,(key_type *)in_stack_fffffffffffff848);
      bVar10 = sVar5 == 0;
    }
    if (!bVar10) {
      VCDU::VCDU(&local_4b8,&local_484);
      ::assembler::Assembler::process(in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0);
      local_4c0 = local_4b0;
      local_4c8._M_current =
           (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
           std::
           vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
           ::begin(in_stack_fffffffffffff838);
      local_4d0 = (unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *)
                  std::
                  vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                  ::end(in_stack_fffffffffffff838);
      while (bVar1 = __gnu_cxx::operator!=
                               ((__normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                                 *)in_stack_fffffffffffff840,
                                (__normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                                 *)in_stack_fffffffffffff838), bVar1) {
        local_4d8 = __gnu_cxx::
                    __normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
                    ::operator*(&local_4c8);
        std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
        operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_> *
                   )0x12e697);
        bVar1 = ::assembler::SessionPDU::hasHeader<lrit::AnnotationHeader>((SessionPDU *)0x12e69f);
        if ((bVar1) && (bVar1 = filter(in_stack_fffffffffffffa38,in_stack_fffffffffffffa30), !bVar1)
           ) {
          if ((local_40 & 1) == 0) {
            std::operator<<((ostream *)&std::cout,"Writing: ");
          }
          else {
            std::operator<<((ostream *)&std::cout,"Writing (dry run): ");
          }
          std::operator+(in_stack_fffffffffffff868,(char *)in_stack_fffffffffffff860);
          filename_abi_cxx11_(in_stack_fffffffffffffa88);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(in_stack_fffffffffffff87f,in_stack_fffffffffffff878),
                         in_stack_fffffffffffff870);
          std::__cxx11::string::~string(local_538);
          std::__cxx11::string::~string(local_518);
          poVar6 = std::operator<<((ostream *)&std::cout,local_4f8);
          std::operator<<(poVar6," ");
          if ((local_40 & 1) == 0) {
            std::ofstream::ofstream(local_738,local_4f8,_S_bin);
            this = std::
                   unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
                   operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                               *)0x12e802);
            this_00 = ::assembler::SessionPDU::get(this);
            puVar7 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data
                               ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x12e82b);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(this_00);
            std::ostream::write(local_738,(long)puVar7);
            std::ofstream::close();
            in_stack_fffffffffffff87f = std::ios::fail();
            if ((in_stack_fffffffffffff87f & 1) == 0) {
              local_d4 = 0;
            }
            else {
              in_stack_fffffffffffff870 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::operator<<((ostream *)&std::cout,"(");
              piVar8 = __errno_location();
              pcVar9 = strerror(*piVar8);
              in_stack_fffffffffffff868 =
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   std::operator<<((ostream *)in_stack_fffffffffffff870,pcVar9);
              in_stack_fffffffffffff860 = std::operator<<((ostream *)in_stack_fffffffffffff868,")");
              std::ostream::operator<<
                        (in_stack_fffffffffffff860,std::endl<char,std::char_traits<char>>);
              local_d4 = 5;
            }
            std::ofstream::~ofstream(local_738);
            if (local_d4 == 0) goto LAB_0012e9b7;
          }
          else {
LAB_0012e9b7:
            poVar6 = std::operator<<((ostream *)&std::cout,"(");
            std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>::
            operator->((unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>
                        *)0x12e9de);
            in_stack_fffffffffffff850 =
                 (set<int,_std::less<int>,_std::allocator<int>_> *)
                 ::assembler::SessionPDU::size((SessionPDU *)0x12e9e6);
            in_stack_fffffffffffff848 =
                 (ostream *)std::ostream::operator<<(poVar6,(ulong)in_stack_fffffffffffff850);
            in_stack_fffffffffffff840 =
                 (Options *)std::operator<<(in_stack_fffffffffffff848," bytes)");
            std::ostream::operator<<
                      (in_stack_fffffffffffff840,std::endl<char,std::char_traits<char>>);
            local_d4 = 0;
          }
          std::__cxx11::string::~string(local_4f8);
        }
        __gnu_cxx::
        __normal_iterator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_*,_std::vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>_>
        ::operator++(&local_4c8);
      }
      std::
      vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
      ::~vector((vector<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>,_std::allocator<std::unique_ptr<assembler::SessionPDU,_std::default_delete<assembler::SessionPDU>_>_>_>
                 *)in_stack_fffffffffffff850);
    }
  }
  ::assembler::Assembler::~Assembler((Assembler *)0x12eaa6);
  local_d4 = 0;
LAB_0012eab1:
  std::unique_ptr<PacketReader,_std::default_delete<PacketReader>_>::~unique_ptr
            ((unique_ptr<PacketReader,_std::default_delete<PacketReader>_> *)
             in_stack_fffffffffffff850);
  Options::~Options(in_stack_fffffffffffff840);
  return local_4;
}

Assistant:

int main(int argc, char** argv) {
  auto opts = parseOptions(argc, argv);

  // Create packet reader depending on options
  std::unique_ptr<PacketReader> reader;
  if (!opts.nanomsg.empty()) {
    reader = std::make_unique<NanomsgReader>(opts.nanomsg);
  } else if (!opts.files.empty()) {
    reader = std::make_unique<FileReader>(opts.files);
  } else {
    std::cerr << "No input specified" << std::endl;
    return 1;
  }

  // Make sure output directory exists
  mkdirp(opts.out);

  // Pass packets to packet assembler
  assembler::Assembler assembler;
  std::array<uint8_t, 892> buf;
  while (reader->nextPacket(buf)) {
    VCDU vcdu(buf);

    // Don't process VCDU if VCID was not specified
    if (!opts.vcids.empty() && opts.vcids.count(vcdu.getVCID()) == 0) {
      continue;
    }

    auto spdus = assembler.process(buf);
    for (auto& spdu : spdus) {

      // Skip stuff without filename
      if (!spdu->hasHeader<lrit::AnnotationHeader>()) {
        continue;
      }

      // Check if we should include this file
      if (filter(opts, spdu)) {
        continue;
      }

      if (opts.dryrun) {
        std::cout << "Writing (dry run): ";
      } else {
        std::cout << "Writing: ";
      }

      const auto name = opts.out + "/" + filename(spdu);
      std::cout << name << " ";

      if (!opts.dryrun) {
        std::ofstream fout(name, std::ofstream::binary);
        const auto& buf = spdu->get();
        fout.write((const char*)buf.data(), buf.size());
        fout.close();
        if (fout.fail()) {
          std::cout << "(" << strerror(errno) << ")" << std::endl;
          continue;
        }
      }

      std::cout << "(" << spdu->size() << " bytes)" << std::endl;
    }
  }
}